

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  BtShared *pBt;
  Pgno parent;
  BtreePayload *pBVar3;
  BtCursor *pCur_00;
  char cVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  MemPage *pMVar8;
  void *v;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  u8 *__s;
  uint *puVar14;
  int rc;
  int loc;
  int rc_1;
  MemPage *pOvfl;
  int local_a8;
  Pgno local_a4;
  uint local_a0;
  int local_9c;
  uint *local_98;
  int local_90;
  int local_8c;
  MemPage *local_88;
  int local_7c;
  KeyInfo *local_78;
  void *local_70;
  uint *local_68;
  BtreePayload *local_60;
  BtShared *local_58;
  UnpackedRecord local_50;
  BtCursor *local_38;
  
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  pBtree = pCur->pBtree;
  local_58 = pBtree->pBt;
  local_9c = seekResult;
  if (((pCur->curFlags & 0x20) != 0) &&
     (local_a8 = saveAllCursors(local_58,pCur->pgnoRoot,pCur), local_a8 != 0)) {
    return local_a8;
  }
  local_50.pKeyInfo = pCur->pKeyInfo;
  local_90 = flags;
  if (local_50.pKeyInfo == (KeyInfo *)0x0) {
    invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if (seekResult == 0) {
        iVar5 = sqlite3BtreeMovetoUnpacked
                          (pCur,(UnpackedRecord *)0x0,pX->nKey,(uint)(local_90 != 0),&local_9c);
        if (iVar5 != 0) {
          return iVar5;
        }
        local_a8 = 0;
      }
    }
    else {
      local_9c = 0;
    }
  }
  else if ((flags & 2U) == 0 && seekResult == 0) {
    if (pX->nMem == 0) {
      local_a8 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)(flags != 0),&local_9c);
    }
    else {
      local_50.aMem = pX->aMem;
      local_50.default_rc = '\0';
      local_50.errCode = '\0';
      local_50.r1 = '\0';
      local_50.r2 = '\0';
      local_50._22_2_ = local_50._22_2_ & 0xff00;
      local_50.nField = pX->nMem;
      local_a8 = sqlite3BtreeMovetoUnpacked(pCur,&local_50,0,(uint)(flags != 0),&local_9c);
    }
    if (local_a8 != 0) {
      return local_a8;
    }
  }
  local_88 = pCur->apPage[pCur->iPage];
  puVar14 = (uint *)local_58->pTmpSpace;
  local_50.pKeyInfo = (KeyInfo *)0x0;
  pBt = local_88->pBt;
  local_a4 = 0;
  bVar1 = local_88->childPtrSize;
  uVar13 = (ulong)bVar1;
  local_98 = puVar14;
  local_60 = pX;
  local_38 = pCur;
  if (local_88->intKey == '\0') {
    pvVar7 = pX->pKey;
    uVar6 = pX->nKey;
    if ((uint)uVar6 < 0x80) {
      *(u8 *)((long)puVar14 + uVar13) = (u8)uVar6;
      uVar12 = 1;
    }
    else {
      uVar12 = sqlite3PutVarint((uchar *)((long)puVar14 + uVar13),(long)(int)(uint)uVar6);
      uVar12 = uVar12 & 0xff;
    }
    iVar5 = uVar12 + bVar1;
    v = (void *)(uVar6 & 0xffffffff);
    local_68 = local_98;
  }
  else {
    uVar6 = (ulong)pX->nData;
    v = (void *)((long)pX->nZero + uVar6);
    local_70 = pX->pData;
    if ((uint)v < 0x80) {
      *(u8 *)((long)puVar14 + uVar13) = (u8)v;
      uVar12 = 1;
    }
    else {
      uVar12 = sqlite3PutVarint((uchar *)(uVar13 + (long)puVar14),(u64)v);
      uVar12 = uVar12 & 0xff;
    }
    uVar12 = uVar12 + bVar1;
    iVar5 = sqlite3PutVarint((uchar *)((long)puVar14 + (ulong)uVar12),local_60->nKey);
    iVar5 = iVar5 + uVar12;
    local_68 = puVar14;
    pvVar7 = local_70;
  }
  iVar9 = (int)v;
  if ((int)(uint)local_88->maxLocal < iVar9) {
    uVar2 = local_88->minLocal;
    uVar12 = (iVar9 - (uint)uVar2) % (local_88->pBt->usableSize - 4) + (uint)uVar2;
    if ((int)(uint)local_88->maxLocal < (int)uVar12) {
      uVar12 = (uint)uVar2;
    }
    uVar13 = (ulong)uVar12;
    local_a0 = iVar5 + uVar12 + 4;
    local_68 = (uint *)((long)(int)(iVar5 + uVar12) + (long)local_68);
  }
  else {
    local_a0 = 4;
    if (4 < iVar9 + iVar5) {
      local_a0 = iVar9 + iVar5;
    }
    uVar13 = (ulong)v & 0xffffffff;
  }
  if (iVar9 < 1) {
    local_78 = (KeyInfo *)0x0;
  }
  else {
    __s = (u8 *)((long)iVar5 + (long)local_98);
    local_78 = (KeyInfo *)0x0;
    do {
      parent = local_a4;
      iVar5 = (int)uVar13;
      if (iVar5 == 0) {
        if (pBt->autoVacuum != '\0') {
          do {
            uVar10 = local_a4;
            local_a4 = uVar10 + 1;
            uVar12 = 0;
            if (1 < local_a4) {
              iVar5 = (uVar10 - 1) - (uVar10 - 1) % (pBt->usableSize / 5 + 1);
              uVar12 = iVar5 + (uint)(iVar5 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
            }
          } while ((local_a4 == uVar12) || (uVar10 == (uint)sqlite3PendingByte / pBt->pageSize));
          local_a4 = uVar10 + 1;
        }
        local_70 = pvVar7;
        local_7c = allocateBtreePage(pBt,(MemPage **)&local_50,&local_a4,local_a4,'\0');
        if (((local_7c == 0 && pBt->autoVacuum != '\0') &&
            (ptrmapPut(pBt,local_a4,'\x04' - (parent == 0),parent,&local_7c), local_7c != 0)) &&
           (local_50.pKeyInfo != (KeyInfo *)0x0)) {
          sqlite3PagerUnrefNotNull((DbPage *)local_50.pKeyInfo[2].aColl[0]);
        }
        iVar9 = local_7c;
        if (local_7c == 0) {
          *local_68 = local_a4 >> 0x18 | (local_a4 & 0xff0000) >> 8 | (local_a4 & 0xff00) << 8 |
                      local_a4 << 0x18;
          if (local_78 != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_78[2].aColl[0]);
          }
          local_68 = *(uint **)(local_50.pKeyInfo + 2);
          *local_68 = 0;
          local_78 = local_50.pKeyInfo;
          __s = (u8 *)(*(long *)(local_50.pKeyInfo + 2) + 4);
          iVar5 = pBt->usableSize - 4;
        }
        else {
          iVar5 = 0;
          if (local_78 != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_78[2].aColl[0]);
          }
          local_8c = iVar9;
        }
        pvVar7 = local_70;
        if (iVar9 != 0) goto LAB_00216d20;
      }
      iVar9 = iVar5;
      if ((int)v < iVar5) {
        iVar9 = (int)v;
      }
      iVar11 = (int)uVar6;
      local_70 = v;
      if (iVar11 < 1) {
        memset(__s,0,(long)iVar9);
      }
      else {
        if (iVar11 <= iVar9) {
          iVar9 = iVar11;
        }
        memcpy(__s,pvVar7,(long)iVar9);
      }
      __s = __s + iVar9;
      pvVar7 = (void *)((long)pvVar7 + (long)iVar9);
      uVar6 = (ulong)(uint)(iVar11 - iVar9);
      uVar13 = (ulong)(uint)(iVar5 - iVar9);
      uVar12 = (int)local_70 - iVar9;
      v = (void *)(ulong)uVar12;
    } while (uVar12 != 0 && iVar9 <= (int)local_70);
  }
  if (local_78 != (KeyInfo *)0x0) {
    sqlite3PagerUnrefNotNull((DbPage *)local_78[2].aColl[0]);
  }
  local_8c = 0;
LAB_00216d20:
  pCur_00 = local_38;
  pBVar3 = local_60;
  pMVar8 = local_88;
  local_a8 = local_8c;
  if (local_8c == 0) {
    uVar2 = local_38->ix;
    uVar12 = (uint)uVar2;
    if (local_9c == 0) {
      local_a8 = sqlite3PagerWrite(local_88->pDbPage);
      if (local_a8 == 0) {
        puVar14 = (uint *)(pMVar8->aData +
                          (CONCAT11(pMVar8->aCellIdx[(ulong)uVar2 * 2],
                                    pMVar8->aCellIdx[(ulong)uVar2 * 2 + 1]) & pMVar8->maskPage));
        if (pMVar8->leaf == '\0') {
          *local_98 = *puVar14;
        }
        local_a8 = clearCell(pMVar8,(uchar *)puVar14,(CellInfo *)&local_50);
        if (((local_a0 == (ushort)local_50._22_2_) &&
            (CONCAT22(local_50._18_2_,local_50.nField) == (uint)(ushort)local_50._20_2_)) &&
           ((local_58->autoVacuum == '\0' || ((int)local_a0 < (int)(uint)local_88->minLocal)))) {
          if (local_88->aDataEnd < (u8 *)((long)puVar14 + (long)(int)local_a0)) {
            pMVar8 = (MemPage *)0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x108ba);
            cVar4 = '\x01';
          }
          else {
            memcpy(puVar14,local_98,(long)(int)local_a0);
            cVar4 = '\x01';
            pMVar8 = (MemPage *)0x0;
          }
        }
        else {
          dropCell(local_88,(uint)uVar2,(uint)(ushort)local_50._22_2_,&local_a8);
          cVar4 = (local_a8 != 0) * '\x02';
        }
      }
      else {
        cVar4 = '\x02';
      }
      if (cVar4 != '\0') {
        if (cVar4 == '\x02') {
          return local_a8;
        }
        return (int)pMVar8;
      }
    }
    else if ((local_9c < 0) && (local_88->nCell != 0)) {
      local_38->ix = uVar2 + 1;
      uVar12 = (uint)(ushort)(uVar2 + 1);
      local_38->curFlags = local_38->curFlags & 0xfd;
    }
    pMVar8 = local_88;
    insertCell(local_88,uVar12,(u8 *)local_98,local_a0,(u8 *)0x0,0,&local_a8);
    (pCur_00->info).nSize = 0;
    if (pMVar8->nOverflow != '\0') {
      pCur_00->curFlags = pCur_00->curFlags & 0xfd;
      local_a8 = balance(pCur_00);
      pCur_00->apPage[pCur_00->iPage]->nOverflow = '\0';
      pCur_00->eState = '\0';
      if ((local_a8 == 0 & (byte)local_90 >> 1) == 1) {
        local_a8 = moveToRoot(pCur_00);
        if (pCur_00->pKeyInfo != (KeyInfo *)0x0) {
          pvVar7 = sqlite3Malloc(pBVar3->nKey);
          pCur_00->pKey = pvVar7;
          if (pvVar7 == (void *)0x0) {
            local_a8 = 7;
          }
          else {
            memcpy(pvVar7,pBVar3->pKey,pBVar3->nKey);
          }
        }
        pCur_00->eState = '\x03';
        pCur_00->nKey = pBVar3->nKey;
      }
    }
  }
  return local_a8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.  */
    assert( (flags & BTREE_SAVEPOSITION)==0 || 
            ((pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey) );

    /* If the cursor is currently on the last row and we are appending a
    ** new row onto the end, set the "loc" to avoid an unnecessary
    ** btreeMoveto() call */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      loc = 0;
    }else if( loc==0 ){
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
    if( pX->nMem ){
      UnpackedRecord r;
      r.pKeyInfo = pCur->pKeyInfo;
      r.aMem = pX->aMem;
      r.nField = pX->nMem;
      r.default_rc = 0;
      r.errCode = 0;
      r.r1 = 0;
      r.r2 = 0;
      r.eqSeen = 0;
      rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
    }else{
      rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
    }
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload 
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). 
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->apPage[pCur->iPage]->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      rc = moveToRoot(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->apPage[pCur->iPage]->nOverflow==0 );

end_insert:
  return rc;
}